

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkGetBddNodeNum(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    pVVar3 = pNtk->vObjs;
    if (pVVar3->nSize < 1) {
      iVar4 = 0;
    }
    else {
      lVar5 = 0;
      iVar4 = 0;
      do {
        pvVar1 = pVVar3->pArray[lVar5];
        if ((pvVar1 != (void *)0x0) && ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7)) {
          if (*(DdNode **)((long)pvVar1 + 0x38) == (DdNode *)0x0) {
            __assert_fail("pNode->pData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                          ,0xff,"int Abc_NtkGetBddNodeNum(Abc_Ntk_t *)");
          }
          if (1 < *(int *)((long)pvVar1 + 0x1c)) {
            iVar2 = Cudd_DagSize(*(DdNode **)((long)pvVar1 + 0x38));
            iVar4 = iVar4 + iVar2 + -1;
          }
        }
        lVar5 = lVar5 + 1;
        pVVar3 = pNtk->vObjs;
      } while (lVar5 < pVVar3->nSize);
    }
    return iVar4;
  }
  __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xfc,"int Abc_NtkGetBddNodeNum(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkGetBddNodeNum( Abc_Ntk_t * pNtk )
{
    int nNodes = 0;
#ifdef ABC_USE_CUDD
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsBddLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        if ( Abc_ObjFaninNum(pNode) < 2 )
            continue;
        nNodes += pNode->pData? -1 + Cudd_DagSize( (DdNode *)pNode->pData ) : 0;
    }
#endif
    return nNodes;
}